

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::LabelTickTime
               (ImPlotTick *tick,ImGuiTextBuffer *buffer,ImPlotTime *t,ImPlotDateTimeFmt fmt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined4 in_R9D;
  ImVec2 IVar4;
  ImPlotDateTimeFmt fmt_00;
  char temp [32];
  
  fmt_00.Time = (undefined4)((ulong)register0x00000080 >> 0x20);
  fmt_00.Date = fmt._8_4_;
  if (tick->ShowLabel == true) {
    iVar1 = (buffer->Buf).Size;
    iVar2 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    tick->TextOffset = iVar2;
    fmt_00._8_4_ = in_R9D;
    FormatDateTime((ImPlot *)t,(ImPlotTime *)temp,(char *)0x20,fmt.Date,fmt_00);
    sVar3 = strlen(temp);
    ImGuiTextBuffer::append(buffer,temp,temp + sVar3 + 1);
    IVar4 = ImGui::CalcTextSize((buffer->Buf).Data + tick->TextOffset,(char *)0x0,false,-1.0);
    tick->LabelSize = IVar4;
  }
  return;
}

Assistant:

inline void LabelTickTime(ImPlotTick& tick, ImGuiTextBuffer& buffer, const ImPlotTime& t, ImPlotDateTimeFmt fmt) {
    char temp[32];
    if (tick.ShowLabel) {
        tick.TextOffset = buffer.size();
        FormatDateTime(t, temp, 32, fmt);
        buffer.append(temp, temp + strlen(temp) + 1);
        tick.LabelSize = ImGui::CalcTextSize(buffer.Buf.Data + tick.TextOffset);
    }
}